

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,char_type *value)

{
  iterator iVar1;
  char_type *in_RDI;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar2;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *in_stack_ffffffffffffffd8;
  cstring_spec_handler *in_stack_ffffffffffffffe0;
  
  uVar2 = *(undefined1 *)(*(long *)(in_RDI + 0x10) + 0x14);
  cstring_spec_handler::cstring_spec_handler
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI);
  handle_cstring_type_spec<char,fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::cstring_spec_handler>
            ((char)((ulong)in_RDI >> 0x38),
             (cstring_spec_handler *)CONCAT17(uVar2,in_stack_ffffffffffffffc8));
  iVar1 = out((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
               *)CONCAT17(uVar2,in_stack_ffffffffffffffc8));
  return (iterator)iVar1.container;
}

Assistant:

iterator operator()(const char_type *value) {
    internal::handle_cstring_type_spec(
          specs_.type_, cstring_spec_handler(*this, value));
    return out();
  }